

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

void __thiscall slang::parsing::Lexer::scanBlockComment(Lexer *this)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  char *pcVar4;
  int unused2;
  uint32_t unused1;
  TriviaKind local_34 [4];
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  bVar2 = tryApplyCommentHandler(this);
  if (bVar2) {
    addTrivia(this,DisabledText);
    return;
  }
  bVar2 = false;
LAB_002edf22:
  while( true ) {
    while( true ) {
      pcVar4 = this->sourceBuffer;
      cVar1 = *pcVar4;
      if (-1 < cVar1) break;
      bVar3 = scanUTF8Char(this,bVar2,(uint32_t *)&local_30,(int *)local_34);
      bVar2 = (bool)(bVar2 | !bVar3);
    }
    if (cVar1 != '\0') break;
    if (this->sourceEnd + -1 <= pcVar4) {
      Diagnostics::add(this->diagnostics,(DiagCode)0x120002,
                       (SourceLocation)
                       (((long)pcVar4 - (long)this->originalBegin) * 0x10000000 |
                       (ulong)((this->bufferId).id & 0xfffffff)));
      pcVar4 = this->sourceBuffer;
LAB_002ee009:
      local_34[0] = BlockComment;
      local_30._M_str = this->marker;
      local_30._M_len = (size_t)(uint)((int)pcVar4 - (int)local_30._M_str);
      SmallVectorBase<slang::parsing::Trivia>::
      emplace_back<slang::parsing::TriviaKind&,std::basic_string_view<char,std::char_traits<char>>>
                (&(this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>,local_34,
                 &local_30);
      return;
    }
    this->errorCount = this->errorCount + 1;
    Diagnostics::add(this->diagnostics,(DiagCode)0x50002,
                     (SourceLocation)
                     (((long)pcVar4 - (long)this->originalBegin) * 0x10000000 |
                     (ulong)((this->bufferId).id & 0xfffffff)));
    this->sourceBuffer = this->sourceBuffer + 1;
    bVar2 = false;
  }
  if (cVar1 == '/') {
    if (pcVar4[1] == '*') {
      Diagnostics::add(this->diagnostics,(DiagCode)0xb0002,
                       (SourceLocation)
                       (((long)pcVar4 - (long)this->originalBegin) * 0x10000000 |
                       (ulong)((this->bufferId).id & 0xfffffff)));
      this->sourceBuffer = this->sourceBuffer + 2;
      bVar2 = false;
      goto LAB_002edf22;
    }
  }
  else if ((cVar1 == '*') && (pcVar4[1] == '/')) {
    pcVar4 = pcVar4 + 2;
    this->sourceBuffer = pcVar4;
    goto LAB_002ee009;
  }
  this->sourceBuffer = pcVar4 + 1;
  bVar2 = false;
  goto LAB_002edf22;
}

Assistant:

void Lexer::scanBlockComment() {
    if (tryApplyCommentHandler()) [[unlikely]] {
        addTrivia(TriviaKind::DisabledText);
        return;
    }

    bool sawUTF8Error = false;
    while (true) {
        char c = peek();
        if (isASCII(c)) {
            sawUTF8Error = false;
            if (c == '*' && peek(1) == '/') {
                advance(2);
                break;
            }
            else if (c == '/' && peek(1) == '*') {
                // nested block comments disallowed by the standard; ignore and continue
                addDiag(diag::NestedBlockComment, currentOffset());
                advance(2);
            }
            else if (c == '\0') {
                if (reallyAtEnd()) {
                    addDiag(diag::UnterminatedBlockComment, currentOffset());
                    break;
                }

                // otherwise just error and ignore
                errorCount++;
                addDiag(diag::EmbeddedNull, currentOffset());
                advance();
            }
            else {
                advance();
            }
        }
        else {
            sawUTF8Error |= !scanUTF8Char(sawUTF8Error);
        }
    }

    addTrivia(TriviaKind::BlockComment);
}